

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O1

void __thiscall
GlobOpt::ArrayUpperBoundCheckHoistInfo::SetCompatibleBoundCheck
          (ArrayUpperBoundCheckHoistInfo *this,BasicBlock *compatibleBoundCheckBlock,
          int indexConstantValue)

{
  code *pcVar1;
  bool bVar2;
  Loop *pLVar3;
  undefined4 *puVar4;
  IntConstantBounds local_30;
  
  pLVar3 = ArrayLowerBoundCheckHoistInfo::Loop(&this->super_ArrayLowerBoundCheckHoistInfo);
  if (pLVar3 != (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x76,"(!Loop())","!Loop()");
    if (!bVar2) goto LAB_004a80cf;
    *puVar4 = 0;
  }
  if (compatibleBoundCheckBlock == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x77,"(compatibleBoundCheckBlock)","compatibleBoundCheckBlock");
    if (!bVar2) {
LAB_004a80cf:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  (this->super_ArrayLowerBoundCheckHoistInfo).compatibleBoundCheckBlock = compatibleBoundCheckBlock;
  (this->super_ArrayLowerBoundCheckHoistInfo).indexSym = (StackSym *)0x0;
  (this->super_ArrayLowerBoundCheckHoistInfo).offset = -1;
  IntConstantBounds::IntConstantBounds(&local_30,indexConstantValue,indexConstantValue);
  (this->super_ArrayLowerBoundCheckHoistInfo).indexConstantBounds = local_30;
  return;
}

Assistant:

void GlobOpt::ArrayUpperBoundCheckHoistInfo::SetCompatibleBoundCheck(
    BasicBlock *const compatibleBoundCheckBlock,
    const int indexConstantValue)
{
    Assert(!Loop());
    Assert(compatibleBoundCheckBlock);

    this->compatibleBoundCheckBlock = compatibleBoundCheckBlock;
    indexSym = nullptr;
    offset = -1; // simulate < instead of <=
    indexConstantBounds = IntConstantBounds(indexConstantValue, indexConstantValue);
}